

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv6Transmitter::PollSocket(RTPUDPv6Transmitter *this,bool rtp)

{
  in6_addr srcip;
  int iVar1;
  ssize_t sVar2;
  RTPIPv6Address *obj;
  uint8_t *__dest;
  ulong numbytes;
  bool bVar3;
  int sock;
  uint fromlen;
  RTPRawPacket *pack;
  size_t len;
  int iStack_10074;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *plStack_10070;
  _func_int **pp_Stack_10068;
  double dStack_10060;
  sockaddr_in6 srcaddr;
  char packetbuffer [65535];
  
  sock = *(int *)((long)(this->destinations).table + (ulong)!rtp * 4 + -0x5c);
  len = 0;
  ioctl(sock,0x541b,&len);
  bVar3 = true;
  if (len == 0) {
    packetbuffer[0] = '\0';
    iVar1 = RTPSelect(&sock,packetbuffer,1,(RTPTime)0x0);
    bVar3 = packetbuffer[0] != '\0';
    if (iVar1 < 0) {
      return iVar1;
    }
  }
  iStack_10074 = 2 - (uint)rtp;
  plStack_10070 = &this->rawpacketlist;
  pp_Stack_10068 = (_func_int **)&PTR_CreateCopy_00145b40;
  do {
    if (!bVar3) {
      return 0;
    }
    do {
      dStack_10060 = (double)RTPTime::CurrentTime();
      fromlen = 0x1c;
      sVar2 = recvfrom(sock,packetbuffer,0xffff,0,(sockaddr *)&srcaddr,&fromlen);
      if ((0 < (int)(uint)sVar2) &&
         ((this->receivemode == AcceptAll ||
          (srcip.__in6_u._8_8_ = srcaddr.sin6_addr.__in6_u._8_8_,
          srcip.__in6_u._0_8_ = srcaddr.sin6_addr.__in6_u._0_8_,
          bVar3 = ShouldAcceptData(this,srcip,srcaddr.sin6_port << 8 | srcaddr.sin6_port >> 8),
          bVar3)))) {
        obj = (RTPIPv6Address *)
              operator_new(0x20,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x17);
        (obj->super_RTPAddress).addresstype = IPv6Address;
        (obj->super_RTPAddress)._vptr_RTPAddress = pp_Stack_10068;
        *(undefined8 *)&(obj->super_RTPAddress).field_0xc = srcaddr.sin6_addr.__in6_u._0_8_;
        *(undefined8 *)&obj->field_0x14 = srcaddr.sin6_addr.__in6_u._8_8_;
        obj->port = srcaddr.sin6_port << 8 | srcaddr.sin6_port >> 8;
        numbytes = (ulong)((uint)sVar2 & 0x7fffffff);
        __dest = (uint8_t *)
                 operator_new__(numbytes,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,
                                iStack_10074);
        if (__dest == (uint8_t *)0x0) {
          RTPDelete<jrtplib::RTPIPv6Address>
                    (obj,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
          return -1;
        }
        memcpy(__dest,packetbuffer,numbytes);
        pack = (RTPRawPacket *)
               operator_new(0x38,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1b);
        (pack->super_RTPMemoryObject).mgr = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        (pack->super_RTPMemoryObject)._vptr_RTPMemoryObject =
             (_func_int **)&PTR__RTPRawPacket_00145070;
        (pack->receivetime).m_t = dStack_10060;
        pack->packetdata = __dest;
        pack->packetdatalength = numbytes;
        pack->senderaddress = (RTPAddress *)obj;
        pack->isrtp = rtp;
        std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
        push_back(plStack_10070,&pack);
      }
      len = 0;
      ioctl(sock,0x541b,&len);
    } while (len != 0);
    pack = (RTPRawPacket *)((ulong)pack & 0xffffffffffffff00);
    iVar1 = RTPSelect(&sock,(int8_t *)&pack,1,(RTPTime)0x0);
    bVar3 = (char)pack != '\0';
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV6TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in6 srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	len = 0;
	RTPIOCTL(sock,FIONREAD,&len);

	if (len <= 0) // make sure a packet of length zero is not queued
	{
		int8_t isset = 0;
		int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (isset)
			dataavailable = true;
		else
			dataavailable = false;
	}
	else
		dataavailable = true;

	while (dataavailable)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		fromlen = sizeof(struct sockaddr_in6);
		recvlen = recvfrom(sock,packetbuffer,RTPUDPV6TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
		if (recvlen > 0)
		{
			bool acceptdata;

			// got data, process it
			if (receivemode == RTPTransmitter::AcceptAll)
				acceptdata = true;
			else
				acceptdata = ShouldAcceptData(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
			
			if (acceptdata)
			{
				RTPRawPacket *pack;
				RTPIPv6Address *addr;
				uint8_t *datacopy;

				addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
				if (addr == 0)
					return ERR_RTP_OUTOFMEM;
				datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
				if (datacopy == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				memcpy(datacopy,packetbuffer,recvlen);
				
				pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,rtp,GetMemoryManager());
				if (pack == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					RTPDeleteByteArray(datacopy,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				rawpacketlist.push_back(pack);	
			}
		}
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
	}
	return 0;
}